

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBJMeshFileLoader.h
# Opt level: O3

void __thiscall irr::scene::COBJMeshFileLoader::SObjMtl::SObjMtl(SObjMtl *this,SObjMtl *o)

{
  _Rb_tree_header *p_Var1;
  SMeshBuffer *pSVar2;
  u8 uVar3;
  undefined2 uVar4;
  f32 fVar5;
  f32 fVar6;
  f32 fVar7;
  SColor SVar8;
  f32 fVar9;
  f32 fVar10;
  f32 fVar11;
  E_MATERIAL_TYPE EVar12;
  SColor SVar13;
  SColor SVar14;
  SColor SVar15;
  CMeshBuffer<irr::video::S3DVertex> *this_00;
  long lVar16;
  
  p_Var1 = &(this->VertMap)._M_t._M_impl.super__Rb_tree_header;
  (this->VertMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->VertMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->VertMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->VertMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->VertMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->Name).str._M_dataplus._M_p = (pointer)&(this->Name).str.field_2;
  (this->Name).str._M_string_length = 0;
  (this->Name).str.field_2._M_local_buf[0] = '\0';
  if (this == o) {
    (this->Group).str._M_dataplus._M_p = (pointer)&(this->Group).str.field_2;
    (this->Group).str._M_string_length = 0;
    (this->Group).str.field_2._M_local_buf[0] = '\0';
  }
  else {
    ::std::__cxx11::string::_M_assign((string *)&this->Name);
    (this->Group).str._M_dataplus._M_p = (pointer)&(this->Group).str.field_2;
    (this->Group).str._M_string_length = 0;
    (this->Group).str.field_2._M_local_buf[0] = '\0';
    ::std::__cxx11::string::_M_assign((string *)&this->Group);
  }
  this->Bumpiness = o->Bumpiness;
  this->Illumination = o->Illumination;
  this->RecalculateNormals = false;
  this_00 = (CMeshBuffer<irr::video::S3DVertex> *)operator_new(0x150);
  CMeshBuffer<irr::video::S3DVertex>::CMeshBuffer(this_00);
  this->Meshbuffer = this_00;
  pSVar2 = o->Meshbuffer;
  lVar16 = 0;
  do {
    video::SMaterialLayer::operator=
              ((SMaterialLayer *)((long)&(this_00->Material).TextureLayers[0].Texture + lVar16),
               (SMaterialLayer *)((long)&(pSVar2->Material).TextureLayers[0].Texture + lVar16));
    lVar16 = lVar16 + 0x20;
  } while (lVar16 != 0x80);
  *(undefined2 *)&(this_00->Material).field_0xb0 = *(undefined2 *)&(pSVar2->Material).field_0xb0;
  EVar12 = (pSVar2->Material).MaterialType;
  SVar13.color = (pSVar2->Material).AmbientColor.color;
  SVar14.color = (pSVar2->Material).DiffuseColor.color;
  SVar15.color = (pSVar2->Material).EmissiveColor.color;
  SVar8.color = (pSVar2->Material).SpecularColor.color;
  fVar9 = (pSVar2->Material).Shininess;
  fVar10 = (pSVar2->Material).MaterialTypeParam;
  fVar11 = (pSVar2->Material).Thickness;
  uVar3 = (pSVar2->Material).AntiAliasing;
  uVar4 = *(undefined2 *)&(pSVar2->Material).field_0xa2;
  fVar5 = (pSVar2->Material).BlendFactor;
  fVar6 = (pSVar2->Material).PolygonOffsetDepthBias;
  fVar7 = (pSVar2->Material).PolygonOffsetSlopeScale;
  (this_00->Material).ZBuffer = (pSVar2->Material).ZBuffer;
  (this_00->Material).AntiAliasing = uVar3;
  *(undefined2 *)&(this_00->Material).field_0xa2 = uVar4;
  (this_00->Material).BlendFactor = fVar5;
  (this_00->Material).PolygonOffsetDepthBias = fVar6;
  (this_00->Material).PolygonOffsetSlopeScale = fVar7;
  (this_00->Material).SpecularColor = (SColor)SVar8.color;
  (this_00->Material).Shininess = fVar9;
  (this_00->Material).MaterialTypeParam = fVar10;
  (this_00->Material).Thickness = fVar11;
  (this_00->Material).MaterialType = EVar12;
  (this_00->Material).AmbientColor = (SColor)SVar13.color;
  (this_00->Material).DiffuseColor = (SColor)SVar14.color;
  (this_00->Material).EmissiveColor = (SColor)SVar15.color;
  return;
}

Assistant:

SObjMtl(const SObjMtl &o) :
				Name(o.Name), Group(o.Group),
				Bumpiness(o.Bumpiness), Illumination(o.Illumination),
				RecalculateNormals(false)
		{
			Meshbuffer = new SMeshBuffer();
			Meshbuffer->Material = o.Meshbuffer->Material;
		}